

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

bool __thiscall lunasvg::SVGPoint::parse(SVGPoint *this,string_view input)

{
  bool bVar1;
  size_t sVar2;
  byte *pbVar3;
  Point value;
  string_view local_30;
  undefined8 local_20;
  
  local_30._M_str = input._M_str;
  local_30._M_len = input._M_len;
  local_20 = 0;
  stripLeadingAndTrailingSpaces(&local_30);
  bVar1 = parseNumber<float>(&local_30,(float *)&local_20);
  if (bVar1) {
    bVar1 = local_30._M_len != 0;
    if (bVar1) {
      bVar1 = true;
      do {
        sVar2 = local_30._M_len - 1;
        pbVar3 = (byte *)(local_30._M_str + 1);
        if ((0x20 < (ulong)(byte)*local_30._M_str) ||
           ((0x100002600U >> ((ulong)(byte)*local_30._M_str & 0x3f) & 1) == 0)) break;
        bVar1 = sVar2 != 0;
        local_30._M_len = sVar2;
        local_30._M_str = (char *)pbVar3;
      } while (sVar2 != 0);
    }
    if (bVar1) {
      bVar1 = parseNumber<float>(&local_30,(float *)((long)&local_20 + 4));
      if (!bVar1) {
        return false;
      }
      if (local_30._M_len != 0) {
        return false;
      }
      *(undefined8 *)&(this->super_SVGProperty).field_0xc = local_20;
      return true;
    }
  }
  return false;
}

Assistant:

bool SVGPoint::parse(std::string_view input)
{
    Point value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpaces(input)
        || !parseNumber(input, value.y)
        || !input.empty()) {
        return false;
    }

    m_value = value;
    return true;
}